

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

bool __thiscall
jrtplib::RTPSources::CheckCollision
          (RTPSources *this,RTPInternalSourceData *srcdat,RTPAddress *senderaddress,bool isrtp)

{
  RTPMemoryManager *pRVar1;
  RTPAddress *pRVar2;
  int iVar3;
  RTPAddress **ppRVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 in_register_00000009;
  RTPAddress *pRVar5;
  
  if ((int)CONCAT71(in_register_00000009,isrtp) == 0) {
    if ((srcdat->super_RTPSourceData).isrtcpaddrset == false) {
      if ((srcdat->super_RTPSourceData).isrtpaddrset != true) goto LAB_0011dec5;
      ppRVar4 = &(srcdat->super_RTPSourceData).rtpaddr;
      goto LAB_0011de31;
    }
    ppRVar4 = &(srcdat->super_RTPSourceData).rtcpaddr;
  }
  else {
    ppRVar4 = &(srcdat->super_RTPSourceData).rtpaddr;
    if ((srcdat->super_RTPSourceData).isrtpaddrset == false) {
      if ((srcdat->super_RTPSourceData).isrtcpaddrset == false) {
        if (senderaddress == (RTPAddress *)0x0) {
          pRVar5 = *ppRVar4;
          if (pRVar5 == (RTPAddress *)0x0) goto LAB_0011e098;
          pRVar1 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
          if (pRVar1 == (RTPMemoryManager *)0x0) {
            (*pRVar5->_vptr_RTPAddress[4])(pRVar5);
          }
          else {
            (*pRVar5->_vptr_RTPAddress[3])(pRVar5);
            (*pRVar1->_vptr_RTPMemoryManager[3])(pRVar1,pRVar5);
          }
          pRVar5 = (RTPAddress *)0x0;
        }
        else {
          iVar3 = (**senderaddress->_vptr_RTPAddress)
                            (senderaddress,(srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr);
          pRVar5 = (RTPAddress *)CONCAT44(extraout_var_01,iVar3);
          if (pRVar5 == (RTPAddress *)0x0) {
            return false;
          }
          pRVar2 = *ppRVar4;
          if (pRVar2 != senderaddress && pRVar2 != (RTPAddress *)0x0) {
            pRVar1 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
            if (pRVar1 == (RTPMemoryManager *)0x0) {
              (*pRVar2->_vptr_RTPAddress[4])(pRVar2);
            }
            else {
              (*pRVar2->_vptr_RTPAddress[3])(pRVar2);
              (*pRVar1->_vptr_RTPMemoryManager[3])(pRVar1,pRVar2);
            }
          }
        }
        *ppRVar4 = pRVar5;
        goto LAB_0011e098;
      }
      ppRVar4 = &(srcdat->super_RTPSourceData).rtcpaddr;
LAB_0011de31:
      pRVar5 = *ppRVar4;
      if (pRVar5 == (RTPAddress *)0x0) {
        if (senderaddress == (RTPAddress *)0x0) {
          if (!isrtp) {
            RTPInternalSourceData::SetRTCPDataAddress(srcdat,(RTPAddress *)0x0);
            return false;
          }
          RTPInternalSourceData::SetRTPDataAddress(srcdat,(RTPAddress *)0x0);
          return false;
        }
      }
      else {
        iVar3 = (*pRVar5->_vptr_RTPAddress[2])(pRVar5,senderaddress);
        if ((char)iVar3 != '\0') {
          if (!isrtp) {
LAB_0011dec5:
            if (senderaddress == (RTPAddress *)0x0) {
              pRVar5 = (srcdat->super_RTPSourceData).rtcpaddr;
              if (pRVar5 != (RTPAddress *)0x0) {
                pRVar1 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
                if (pRVar1 == (RTPMemoryManager *)0x0) {
                  (*pRVar5->_vptr_RTPAddress[4])(pRVar5);
                }
                else {
                  (*pRVar5->_vptr_RTPAddress[3])(pRVar5);
                  (*pRVar1->_vptr_RTPMemoryManager[3])(pRVar1,pRVar5);
                }
                (srcdat->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
              }
            }
            else {
              iVar3 = (**senderaddress->_vptr_RTPAddress)
                                (senderaddress,
                                 (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr);
              if ((RTPAddress *)CONCAT44(extraout_var_00,iVar3) == (RTPAddress *)0x0) {
                return false;
              }
              pRVar5 = (srcdat->super_RTPSourceData).rtcpaddr;
              if (pRVar5 != senderaddress && pRVar5 != (RTPAddress *)0x0) {
                pRVar1 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
                if (pRVar1 == (RTPMemoryManager *)0x0) {
                  (*pRVar5->_vptr_RTPAddress[4])(pRVar5);
                }
                else {
                  (*pRVar5->_vptr_RTPAddress[3])(pRVar5);
                  (*pRVar1->_vptr_RTPMemoryManager[3])(pRVar1,pRVar5);
                }
              }
              (srcdat->super_RTPSourceData).rtcpaddr = (RTPAddress *)CONCAT44(extraout_var_00,iVar3)
              ;
            }
            (srcdat->super_RTPSourceData).isrtcpaddrset = true;
            return false;
          }
          if (senderaddress == (RTPAddress *)0x0) {
            pRVar5 = (srcdat->super_RTPSourceData).rtpaddr;
            if (pRVar5 != (RTPAddress *)0x0) {
              pRVar1 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
              if (pRVar1 == (RTPMemoryManager *)0x0) {
                (*pRVar5->_vptr_RTPAddress[4])(pRVar5);
              }
              else {
                (*pRVar5->_vptr_RTPAddress[3])(pRVar5);
                (*pRVar1->_vptr_RTPMemoryManager[3])(pRVar1,pRVar5);
              }
              (srcdat->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
            }
          }
          else {
            iVar3 = (**senderaddress->_vptr_RTPAddress)
                              (senderaddress,(srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr
                              );
            if ((RTPAddress *)CONCAT44(extraout_var,iVar3) == (RTPAddress *)0x0) {
              return false;
            }
            pRVar5 = (srcdat->super_RTPSourceData).rtpaddr;
            if (pRVar5 != senderaddress && pRVar5 != (RTPAddress *)0x0) {
              pRVar1 = (srcdat->super_RTPSourceData).super_RTPMemoryObject.mgr;
              if (pRVar1 == (RTPMemoryManager *)0x0) {
                (*pRVar5->_vptr_RTPAddress[4])(pRVar5);
              }
              else {
                (*pRVar5->_vptr_RTPAddress[3])(pRVar5);
                (*pRVar1->_vptr_RTPMemoryManager[3])(pRVar1,pRVar5);
              }
            }
            (srcdat->super_RTPSourceData).rtpaddr = (RTPAddress *)CONCAT44(extraout_var,iVar3);
          }
LAB_0011e098:
          (srcdat->super_RTPSourceData).isrtpaddrset = true;
          return false;
        }
      }
      goto LAB_0011df93;
    }
  }
  pRVar5 = *ppRVar4;
  if (pRVar5 == (RTPAddress *)0x0) {
    if (senderaddress == (RTPAddress *)0x0) {
      return false;
    }
  }
  else {
    iVar3 = (*pRVar5->_vptr_RTPAddress[1])(pRVar5,senderaddress);
    if ((char)iVar3 != '\0') {
      return false;
    }
  }
LAB_0011df93:
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[4])(this,srcdat,senderaddress,isrtp);
  return true;
}

Assistant:

bool RTPSources::CheckCollision(RTPInternalSourceData *srcdat,const RTPAddress *senderaddress,bool isrtp)
{
	bool isset,otherisset;
	const RTPAddress *addr,*otheraddr;
	
	if (isrtp)
	{
		isset = srcdat->IsRTPAddressSet();
		addr = srcdat->GetRTPDataAddress();
		otherisset = srcdat->IsRTCPAddressSet();
		otheraddr = srcdat->GetRTCPDataAddress();
	}
	else
	{
		isset = srcdat->IsRTCPAddressSet();
		addr = srcdat->GetRTCPDataAddress();
		otherisset = srcdat->IsRTPAddressSet();
		otheraddr = srcdat->GetRTPDataAddress();
	}

	if (!isset)
	{
		if (otherisset) // got other address, can check if it comes from same host
		{
			if (otheraddr == 0) // other came from our own session
			{
				if (senderaddress != 0)
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, store it

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
			else
			{
				if (!otheraddr->IsFromSameHost(senderaddress))
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, comes from same host, store the address

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
		}
		else // no other address, store this one
		{
			if (isrtp)
				srcdat->SetRTPDataAddress(senderaddress);
			else
				srcdat->SetRTCPDataAddress(senderaddress);
		}
	}
	else // already got an address
	{
		if (addr == 0)
		{
			if (senderaddress != 0)
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
		else
		{
			if (!addr->IsSameAddress(senderaddress))
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
	}
	
	return false;
}